

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ContactConstraint::calcConstraintForces
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,
          MatrixNd *GSys,VectorNd *LagrangeMultipliersSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  reference pvVar1;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar2;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RCX;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  long in_RDI;
  Vector3d *unaff_retaddr;
  undefined4 in_stack_00000008;
  uint in_stack_0000000c;
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *in_stack_00000010;
  Model *in_stack_00000018;
  long in_stack_00000020;
  byte in_stack_00000028;
  uint i_1;
  uint i;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffde8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffe08;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_stack_fffffffffffffe10;
  Model *pMVar3;
  undefined4 in_stack_fffffffffffffe20;
  value_type in_stack_fffffffffffffe24;
  long in_stack_fffffffffffffe28;
  reference in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe6b;
  value_type body_id;
  VectorNd *in_stack_fffffffffffffe70;
  Model *in_stack_fffffffffffffe78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe90;
  undefined4 local_60;
  undefined4 local_5c;
  long lVar4;
  undefined1 update_kinematics;
  
  lVar4 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  update_kinematics = (undefined1)((ulong)lVar4 >> 0x38);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator=((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffffdf0,
              (vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffffde8);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  body_id = *pvVar1;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  CalcBodyToBaseCoordinates
            (in_stack_00000018,(VectorNd *)in_stack_00000010,in_stack_0000000c,unaff_retaddr,
             (bool)update_kinematics);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_fffffffffffffdf0,(Vector3_t *)in_stack_fffffffffffffde8);
  if ((in_stack_00000028 & 1) != 0) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_0000000c,in_stack_00000008),1);
    in_stack_fffffffffffffe24 = *pvVar1;
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_0000000c,in_stack_00000008),0);
    *pvVar1 = in_stack_fffffffffffffe24;
    in_stack_fffffffffffffe28 = in_stack_00000020 + 0x50;
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,0);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffffdf0,(Vector3_t *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffe30 =
         std::
         vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
         ::operator[](in_stack_00000010,1);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,0);
    Matrix3_t::operator=
              ((Matrix3_t *)in_stack_fffffffffffffdf0,(Matrix3_t *)in_stack_fffffffffffffde8);
  }
  pMVar3 = in_stack_00000018;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            (in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  local_5c = 0;
  while( true ) {
    this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(ulong)local_5c;
    pMVar2 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38));
    if (pMVar2 <= this_00) break;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_00000018,(ulong)local_5c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffdf0);
    local_5c = local_5c + 1;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero(in_stack_fffffffffffffdf0);
  for (local_60 = 0; local_60 < *(uint *)(in_RDI + 0x30); local_60 = local_60 + 1) {
    in_stack_fffffffffffffe08 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
          *)std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                      ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),
                       (ulong)local_60);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
               in_stack_fffffffffffffdf0,(Index)in_stack_fffffffffffffde8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (in_RCX,(double *)in_stack_fffffffffffffe30);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (this_00,in_stack_fffffffffffffe08);
  }
  if ((in_stack_00000028 & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
    CalcBodyWorldOrientation
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,body_id,
               (bool)in_stack_fffffffffffffe6b);
    Matrix3_t::operator=((Matrix3_t *)in_RSI,(Matrix3_t *)in_stack_fffffffffffffde8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffde8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_00000018,0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (int)((ulong)pMVar3 >> 0x20),(int)pMVar3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)in_RSI,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffffde8);
  }
  else {
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_00000018,0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (int)((ulong)pMVar3 >> 0x20),(int)pMVar3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)
               in_stack_fffffffffffffdf0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffde8);
    in_RSI = in_stack_fffffffffffffdf0;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffe08);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_00000018,1);
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
             ,(int)((ulong)pMVar3 >> 0x20),(int)pMVar3);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)in_RSI,
             in_stack_fffffffffffffde8);
  return;
}

Assistant:

void ContactConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagrangeMultipliersSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{

  //Size the vectors of bodies, local frames, and spatial vectors
  constraintBodiesUpd       = bodyIds;
  constraintBodyFramesUpd   = bodyFrames;

  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = constraintBodiesUpd[1];
    constraintBodyFramesUpd[0].r = cache.vec3A;
    constraintBodyFramesUpd[0].E = constraintBodyFramesUpd[1].E;
  }


  constraintForcesUpd.resize(bodyIds.size());
  for(unsigned int i=0; i< bodyIds.size(); ++i){
    constraintForcesUpd[i].setZero();
  }
  //Evaluate the total force the constraint applies to the contact point
  cache.vec3A.setZero();
  for(unsigned int i=0; i < sizeOfConstraint; ++i){
    //The only reason that we can use T here is that it is resolved
    //at the origin of the ground frame.
    cache.vec3A += T[i]*LagrangeMultipliersSys[rowInSystem+i];
  }

  //Update the forces applied to the body in the frame of the body
  if(resolveAllInRootFrame){
    constraintForcesUpd[0].block(3,0,3,1) = cache.vec3A;
  }else{
    cache.mat3A = CalcBodyWorldOrientation(model,Q,bodyIds[0],false);
    constraintForcesUpd[0].block(3,0,3,1) = cache.mat3A*cache.vec3A;
  }

  //Update the forces applied to the ground in the frame of the ground
  constraintForcesUpd[1].block(3,0,3,1) = -cache.vec3A;
}